

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O2

vector<duckdb::PartitionStatistics,_true> * __thiscall
duckdb::RowGroupCollection::GetPartitionStats
          (vector<duckdb::PartitionStatistics,_true> *__return_storage_ptr__,
          RowGroupCollection *this)

{
  SegmentIterator __begin1;
  SegmentIterator local_48;
  SegmentIterationHelper local_38;
  PartitionStatistics local_30;
  
  (__return_storage_ptr__->
  super_vector<duckdb::PartitionStatistics,_std::allocator<duckdb::PartitionStatistics>_>).
  super__Vector_base<duckdb::PartitionStatistics,_std::allocator<duckdb::PartitionStatistics>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::PartitionStatistics,_std::allocator<duckdb::PartitionStatistics>_>).
  super__Vector_base<duckdb::PartitionStatistics,_std::allocator<duckdb::PartitionStatistics>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::PartitionStatistics,_std::allocator<duckdb::PartitionStatistics>_>).
  super__Vector_base<duckdb::PartitionStatistics,_std::allocator<duckdb::PartitionStatistics>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.tree =
       &shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&this->row_groups)->
        super_SegmentTree<duckdb::RowGroup,_true>;
  local_48 = SegmentTree<duckdb::RowGroup,_true>::SegmentIterationHelper::begin(&local_38);
  while (local_48.current != (RowGroup *)0x0) {
    RowGroup::GetPartitionStats(&local_30,local_48.current);
    ::std::vector<duckdb::PartitionStatistics,_std::allocator<duckdb::PartitionStatistics>_>::
    emplace_back<duckdb::PartitionStatistics>
              (&__return_storage_ptr__->
                super_vector<duckdb::PartitionStatistics,_std::allocator<duckdb::PartitionStatistics>_>
               ,&local_30);
    SegmentTree<duckdb::RowGroup,_true>::SegmentIterationHelper::SegmentIterator::Next(&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<PartitionStatistics> RowGroupCollection::GetPartitionStats() const {
	vector<PartitionStatistics> result;
	for (auto &row_group : row_groups->Segments()) {
		result.push_back(row_group.GetPartitionStats());
	}
	return result;
}